

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O0

int __thiscall cmake::CheckBuildSystem(cmake *this)

{
  cmFileTimeComparison *pcVar1;
  Snapshot snapshot;
  Snapshot snapshot_00;
  bool bVar2;
  char *pcVar3;
  ulong uVar4;
  ostream *poVar5;
  cmLocalGenerator *pcVar6;
  cmMakefile *this_00;
  cmGlobalGenerator *pcVar7;
  reference pbVar8;
  char *pcVar9;
  reference pbVar10;
  bool bVar11;
  string local_1828 [32];
  undefined1 local_1808 [8];
  ostringstream msg_7;
  int local_168c;
  string local_1688 [4];
  int result_2;
  undefined1 local_1668 [8];
  ostringstream msg_6;
  int local_14ec;
  iterator iStack_14e8;
  int result_1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_14e0;
  string local_14d8 [8];
  string out_oldest;
  iterator out;
  undefined1 local_1490 [8];
  ostringstream msg_5;
  int local_1314;
  iterator iStack_1310;
  int result;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1308;
  string local_1300 [8];
  string dep_newest;
  iterator dep;
  undefined1 local_12b8 [8];
  ostringstream msg_4;
  allocator local_1139;
  string local_1138;
  allocator local_1111;
  string local_1110;
  allocator local_10e9;
  string local_10e8;
  char *local_10c8;
  char *outputsStr;
  string local_10b8;
  char *local_1098;
  char *dependsStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  outputs;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  depends;
  undefined1 local_1040 [8];
  ostringstream msg_3;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ec8;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_ec0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_eb8;
  const_iterator pi;
  string local_ea8;
  allocator local_e81;
  string local_e80;
  char *local_e60;
  char *productStr;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  products;
  Snapshot local_e30;
  auto_ptr<cmLocalGenerator> local_e18;
  auto_ptr<cmLocalGenerator> lgd;
  string local_e08;
  auto_ptr<cmGlobalGenerator> local_de8;
  auto_ptr<cmGlobalGenerator> ggd;
  string local_dd8;
  char *local_db8;
  char *genName;
  string local_da8 [32];
  undefined1 local_d88 [8];
  ostringstream msg_2;
  cmMakefile *mf;
  Snapshot local_bf8;
  auto_ptr<cmLocalGenerator> local_be0;
  auto_ptr<cmLocalGenerator> lg;
  cmGlobalGenerator gg;
  string local_608;
  allocator local_5e1;
  string local_5e0;
  undefined1 local_5c0 [8];
  cmake cm;
  ostringstream local_340 [8];
  ostringstream msg_1;
  string local_1c8 [48];
  ostringstream local_198 [8];
  ostringstream msg;
  bool verbose;
  cmake *this_local;
  
  pcVar3 = cmsys::SystemTools::GetEnv("VERBOSE");
  bVar11 = false;
  if (pcVar3 != (char *)0x0) {
    pcVar3 = cmsys::SystemTools::GetEnv("CMAKE_NO_VERBOSE");
    bVar11 = pcVar3 == (char *)0x0;
  }
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    pcVar3 = (char *)std::__cxx11::string::c_str();
    bVar2 = cmsys::SystemTools::FileExists(pcVar3);
    if (bVar2) {
      cmake((cmake *)local_5c0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_5e0,"",&local_5e1);
      SetHomeDirectory((cmake *)local_5c0,&local_5e0);
      std::__cxx11::string::~string((string *)&local_5e0);
      std::allocator<char>::~allocator((allocator<char> *)&local_5e1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_608,"",(allocator *)&gg.field_0x5c7);
      SetHomeOutputDirectory((cmake *)local_5c0,&local_608);
      std::__cxx11::string::~string((string *)&local_608);
      std::allocator<char>::~allocator((allocator<char> *)&gg.field_0x5c7);
      cmGlobalGenerator::cmGlobalGenerator((cmGlobalGenerator *)&lg,(cmake *)local_5c0);
      cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator((iterator *)&mf);
      cmState::Snapshot::Snapshot(&local_bf8,(cmState *)0x0,_mf);
      snapshot.Position.Tree = local_bf8.Position.Tree;
      snapshot.State = local_bf8.State;
      snapshot.Position.Position = local_bf8.Position.Position;
      pcVar6 = cmGlobalGenerator::MakeLocalGenerator
                         ((cmGlobalGenerator *)&lg,snapshot,(cmLocalGenerator *)0x0);
      cmsys::auto_ptr<cmLocalGenerator>::auto_ptr(&local_be0,pcVar6);
      pcVar6 = cmsys::auto_ptr<cmLocalGenerator>::operator->(&local_be0);
      this_00 = cmLocalGenerator::GetMakefile(pcVar6);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      bVar2 = cmMakefile::ReadListFile(this_00,pcVar3);
      if ((!bVar2) || (bVar2 = cmSystemTools::GetErrorOccuredFlag(), bVar2)) {
        if (bVar11 != false) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_d88);
          poVar5 = std::operator<<((ostream *)local_d88,"Re-run cmake error reading : ");
          poVar5 = std::operator<<(poVar5,(string *)&this->CheckBuildSystemArgument);
          std::operator<<(poVar5,"\n");
          std::__cxx11::ostringstream::str();
          pcVar3 = (char *)std::__cxx11::string::c_str();
          cmSystemTools::Stdout(pcVar3);
          std::__cxx11::string::~string(local_da8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_d88);
        }
        this_local._4_4_ = 1;
        genName._4_4_ = 1;
      }
      else {
        if ((this->ClearBuildSystem & 1U) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_dd8,"CMAKE_DEPENDS_GENERATOR",(allocator *)((long)&ggd.x_ + 7)
                    );
          pcVar3 = cmMakefile::GetDefinition(this_00,&local_dd8);
          std::__cxx11::string::~string((string *)&local_dd8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&ggd.x_ + 7));
          if ((pcVar3 == (char *)0x0) || (local_db8 = pcVar3, *pcVar3 == '\0')) {
            local_db8 = "Unix Makefiles";
          }
          pcVar3 = local_db8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_e08,pcVar3,(allocator *)((long)&lgd.x_ + 7))
          ;
          pcVar7 = CreateGlobalGenerator(this,&local_e08);
          cmsys::auto_ptr<cmGlobalGenerator>::auto_ptr(&local_de8,pcVar7);
          std::__cxx11::string::~string((string *)&local_e08);
          std::allocator<char>::~allocator((allocator<char> *)((long)&lgd.x_ + 7));
          pcVar7 = cmsys::auto_ptr<cmGlobalGenerator>::get(&local_de8);
          if (pcVar7 != (cmGlobalGenerator *)0x0) {
            pcVar7 = cmsys::auto_ptr<cmGlobalGenerator>::operator->(&local_de8);
            cmLinkedTree<cmState::SnapshotDataType>::iterator::iterator
                      ((iterator *)
                       &products.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
            cmState::Snapshot::Snapshot(&local_e30,(cmState *)0x0,stack0xfffffffffffff1c0);
            snapshot_00.Position.Tree = local_e30.Position.Tree;
            snapshot_00.State = local_e30.State;
            snapshot_00.Position.Position = local_e30.Position.Position;
            pcVar6 = cmGlobalGenerator::MakeLocalGenerator
                               (pcVar7,snapshot_00,(cmLocalGenerator *)0x0);
            cmsys::auto_ptr<cmLocalGenerator>::auto_ptr(&local_e18,pcVar6);
            pcVar6 = cmsys::auto_ptr<cmLocalGenerator>::operator->(&local_e18);
            (*pcVar6->_vptr_cmLocalGenerator[9])(pcVar6,this_00,(ulong)bVar11);
            cmsys::auto_ptr<cmLocalGenerator>::~auto_ptr(&local_e18);
          }
          cmsys::auto_ptr<cmGlobalGenerator>::~auto_ptr(&local_de8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&productStr);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_e80,"CMAKE_MAKEFILE_PRODUCTS",&local_e81);
        pcVar3 = cmMakefile::GetDefinition(this_00,&local_e80);
        std::__cxx11::string::~string((string *)&local_e80);
        std::allocator<char>::~allocator((allocator<char> *)&local_e81);
        local_e60 = pcVar3;
        if (pcVar3 != (char *)0x0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_ea8,pcVar3,(allocator *)((long)&pi._M_current + 7));
          cmSystemTools::ExpandListArgument
                    (&local_ea8,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&productStr,false);
          std::__cxx11::string::~string((string *)&local_ea8);
          std::allocator<char>::~allocator((allocator<char> *)((long)&pi._M_current + 7));
        }
        local_ec0._M_current =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&productStr);
        __gnu_cxx::
        __normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
        ::__normal_iterator<std::__cxx11::string*>
                  ((__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                    *)&local_eb8,&local_ec0);
        while( true ) {
          local_ec8._M_current =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&productStr);
          bVar2 = __gnu_cxx::operator!=(&local_eb8,&local_ec8);
          if (!bVar2) break;
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator->(&local_eb8);
          pcVar3 = (char *)std::__cxx11::string::c_str();
          bVar2 = cmsys::SystemTools::FileExists(pcVar3);
          if (!bVar2) {
            pbVar8 = __gnu_cxx::
                     __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator*(&local_eb8);
            bVar2 = cmsys::SystemTools::FileIsSymlink(pbVar8);
            if (!bVar2) {
              if (bVar11 != false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1040);
                poVar5 = std::operator<<((ostream *)local_1040,"Re-run cmake, missing byproduct: ");
                pbVar8 = __gnu_cxx::
                         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator*(&local_eb8);
                poVar5 = std::operator<<(poVar5,(string *)pbVar8);
                std::operator<<(poVar5,"\n");
                std::__cxx11::ostringstream::str();
                pcVar3 = (char *)std::__cxx11::string::c_str();
                cmSystemTools::Stdout(pcVar3);
                std::__cxx11::string::~string
                          ((string *)
                           &depends.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1040);
              }
              this_local._4_4_ = 1;
              genName._4_4_ = 1;
              goto LAB_0056ec53;
            }
          }
          __gnu_cxx::
          __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator++(&local_eb8);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&outputs.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&dependsStr);
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_10b8,"CMAKE_MAKEFILE_DEPENDS",
                   (allocator *)((long)&outputsStr + 7));
        pcVar3 = cmMakefile::GetDefinition(this_00,&local_10b8);
        std::__cxx11::string::~string((string *)&local_10b8);
        std::allocator<char>::~allocator((allocator<char> *)((long)&outputsStr + 7));
        local_1098 = pcVar3;
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)&local_10e8,"CMAKE_MAKEFILE_OUTPUTS",&local_10e9);
        pcVar9 = cmMakefile::GetDefinition(this_00,&local_10e8);
        std::__cxx11::string::~string((string *)&local_10e8);
        std::allocator<char>::~allocator((allocator<char> *)&local_10e9);
        pcVar3 = local_1098;
        local_10c8 = pcVar9;
        if ((local_1098 != (char *)0x0) && (pcVar9 != (char *)0x0)) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1110,pcVar3,&local_1111);
          cmSystemTools::ExpandListArgument
                    (&local_1110,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&outputs.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,false);
          std::__cxx11::string::~string((string *)&local_1110);
          std::allocator<char>::~allocator((allocator<char> *)&local_1111);
          pcVar3 = local_10c8;
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1138,pcVar3,&local_1139);
          cmSystemTools::ExpandListArgument
                    (&local_1138,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&dependsStr,false);
          std::__cxx11::string::~string((string *)&local_1138);
          std::allocator<char>::~allocator((allocator<char> *)&local_1139);
        }
        bVar2 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)&outputs.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if ((bVar2) ||
           (bVar2 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&dependsStr), bVar2)) {
          if (bVar11 != false) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_12b8);
            std::operator<<((ostream *)local_12b8,
                            "Re-run cmake no CMAKE_MAKEFILE_DEPENDS or CMAKE_MAKEFILE_OUTPUTS :\n");
            std::__cxx11::ostringstream::str();
            pcVar3 = (char *)std::__cxx11::string::c_str();
            cmSystemTools::Stdout(pcVar3);
            std::__cxx11::string::~string((string *)&dep);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_12b8);
          }
          this_local._4_4_ = 1;
          genName._4_4_ = 1;
        }
        else {
          dep_newest.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&outputs.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          local_1308 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&dep_newest.field_2 + 8),0);
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_1308);
          std::__cxx11::string::string(local_1300,(string *)pbVar10);
          while( true ) {
            iStack_1310 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&outputs.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&dep_newest.field_2 + 8),&stack0xffffffffffffecf0);
            if (!bVar2) break;
            local_1314 = 0;
            pcVar1 = this->FileComparison;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&dep_newest.field_2 + 8));
            pcVar9 = (char *)std::__cxx11::string::c_str();
            bVar2 = cmFileTimeComparison::FileTimeCompare(pcVar1,pcVar3,pcVar9,&local_1314);
            if (!bVar2) {
              if (bVar11 != false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1490);
                std::operator<<((ostream *)local_1490,
                                "Re-run cmake: build system dependency is missing\n");
                std::__cxx11::ostringstream::str();
                pcVar3 = (char *)std::__cxx11::string::c_str();
                cmSystemTools::Stdout(pcVar3);
                std::__cxx11::string::~string((string *)&out);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1490);
              }
              this_local._4_4_ = 1;
              genName._4_4_ = 1;
              goto LAB_0056ec03;
            }
            if (local_1314 < 0) {
              pbVar10 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&dep_newest.field_2 + 8));
              std::__cxx11::string::operator=(local_1300,(string *)pbVar10);
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&dep_newest.field_2 + 8));
          }
          out_oldest.field_2._8_8_ =
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&dependsStr);
          local_14e0 = __gnu_cxx::
                       __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&out_oldest.field_2 + 8),0);
          pbVar10 = __gnu_cxx::
                    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator*(&local_14e0);
          std::__cxx11::string::string(local_14d8,(string *)pbVar10);
          while( true ) {
            iStack_14e8 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&dependsStr);
            bVar2 = __gnu_cxx::operator!=
                              ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)((long)&out_oldest.field_2 + 8),&stack0xffffffffffffeb18);
            if (!bVar2) break;
            local_14ec = 0;
            pcVar1 = this->FileComparison;
            pcVar3 = (char *)std::__cxx11::string::c_str();
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator->((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&out_oldest.field_2 + 8));
            pcVar9 = (char *)std::__cxx11::string::c_str();
            bVar2 = cmFileTimeComparison::FileTimeCompare(pcVar1,pcVar3,pcVar9,&local_14ec);
            if (!bVar2) {
              if (bVar11 != false) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1668);
                std::operator<<((ostream *)local_1668,
                                "Re-run cmake: build system output is missing\n");
                std::__cxx11::ostringstream::str();
                pcVar3 = (char *)std::__cxx11::string::c_str();
                cmSystemTools::Stdout(pcVar3);
                std::__cxx11::string::~string(local_1688);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1668);
              }
              this_local._4_4_ = 1;
              goto LAB_0056ebe7;
            }
            if (0 < local_14ec) {
              pbVar10 = __gnu_cxx::
                        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::operator*((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)((long)&out_oldest.field_2 + 8));
              std::__cxx11::string::operator=(local_14d8,(string *)pbVar10);
            }
            __gnu_cxx::
            __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)((long)&out_oldest.field_2 + 8));
          }
          local_168c = 0;
          pcVar1 = this->FileComparison;
          pcVar3 = (char *)std::__cxx11::string::c_str();
          pcVar9 = (char *)std::__cxx11::string::c_str();
          bVar2 = cmFileTimeComparison::FileTimeCompare(pcVar1,pcVar3,pcVar9,&local_168c);
          if ((bVar2) && (-1 < local_168c)) {
            this_local._4_4_ = 0;
          }
          else {
            if (bVar11 != false) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1808);
              poVar5 = std::operator<<((ostream *)local_1808,"Re-run cmake file: ");
              poVar5 = std::operator<<(poVar5,local_14d8);
              poVar5 = std::operator<<(poVar5," older than: ");
              poVar5 = std::operator<<(poVar5,local_1300);
              std::operator<<(poVar5,"\n");
              std::__cxx11::ostringstream::str();
              pcVar3 = (char *)std::__cxx11::string::c_str();
              cmSystemTools::Stdout(pcVar3);
              std::__cxx11::string::~string(local_1828);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1808);
            }
            this_local._4_4_ = 1;
          }
LAB_0056ebe7:
          genName._4_4_ = 1;
          std::__cxx11::string::~string(local_14d8);
LAB_0056ec03:
          std::__cxx11::string::~string(local_1300);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&dependsStr);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&outputs.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
LAB_0056ec53:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&productStr);
      }
      cmsys::auto_ptr<cmLocalGenerator>::~auto_ptr(&local_be0);
      cmGlobalGenerator::~cmGlobalGenerator((cmGlobalGenerator *)&lg);
      ~cmake((cmake *)local_5c0);
    }
    else {
      if (bVar11 != false) {
        std::__cxx11::ostringstream::ostringstream(local_340);
        poVar5 = std::operator<<((ostream *)local_340,"Re-run cmake missing file: ");
        poVar5 = std::operator<<(poVar5,(string *)&this->CheckBuildSystemArgument);
        std::operator<<(poVar5,"\n");
        std::__cxx11::ostringstream::str();
        pcVar3 = (char *)std::__cxx11::string::c_str();
        cmSystemTools::Stdout(pcVar3);
        std::__cxx11::string::~string((string *)&cm.CurrentSnapshot.Position.Position);
        std::__cxx11::ostringstream::~ostringstream(local_340);
      }
      this_local._4_4_ = 1;
    }
  }
  else {
    if (bVar11) {
      std::__cxx11::ostringstream::ostringstream(local_198);
      std::operator<<((ostream *)local_198,"Re-run cmake no build system arguments\n");
      std::__cxx11::ostringstream::str();
      pcVar3 = (char *)std::__cxx11::string::c_str();
      cmSystemTools::Stdout(pcVar3);
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::ostringstream::~ostringstream(local_198);
    }
    this_local._4_4_ = 1;
  }
  return this_local._4_4_;
}

Assistant:

int cmake::CheckBuildSystem()
{
  // We do not need to rerun CMake.  Check dependency integrity.  Use
  // the make system's VERBOSE environment variable to enable verbose
  // output. This can be skipped by setting CMAKE_NO_VERBOSE (which is set
  // by the Eclipse and KDevelop generators).
  bool verbose = ((cmSystemTools::GetEnv("VERBOSE") != 0)
                   && (cmSystemTools::GetEnv("CMAKE_NO_VERBOSE") == 0));

  // This method will check the integrity of the build system if the
  // option was given on the command line.  It reads the given file to
  // determine whether CMake should rerun.

  // If no file is provided for the check, we have to rerun.
  if(this->CheckBuildSystemArgument.empty())
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake no build system arguments\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // If the file provided does not exist, we have to rerun.
  if(!cmSystemTools::FileExists(this->CheckBuildSystemArgument.c_str()))
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake missing file: "
          << this->CheckBuildSystemArgument << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // Read the rerun check file and use it to decide whether to do the
  // global generate.
  cmake cm;
  cm.SetHomeDirectory("");
  cm.SetHomeOutputDirectory("");
  cmGlobalGenerator gg(&cm);
  cmsys::auto_ptr<cmLocalGenerator> lg(gg.MakeLocalGenerator());
  cmMakefile* mf = lg->GetMakefile();
  if(!mf->ReadListFile(this->CheckBuildSystemArgument.c_str()) ||
     cmSystemTools::GetErrorOccuredFlag())
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake error reading : "
          << this->CheckBuildSystemArgument << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    // There was an error reading the file.  Just rerun.
    return 1;
    }

  if(this->ClearBuildSystem)
    {
    // Get the generator used for this build system.
    const char* genName = mf->GetDefinition("CMAKE_DEPENDS_GENERATOR");
    if(!genName || genName[0] == '\0')
      {
      genName = "Unix Makefiles";
      }

    // Create the generator and use it to clear the dependencies.
    cmsys::auto_ptr<cmGlobalGenerator>
      ggd(this->CreateGlobalGenerator(genName));
    if(ggd.get())
      {
      cmsys::auto_ptr<cmLocalGenerator> lgd(ggd->MakeLocalGenerator());
      lgd->ClearDependencies(mf, verbose);
      }
    }

  // If any byproduct of makefile generation is missing we must re-run.
  std::vector<std::string> products;
  if(const char* productStr = mf->GetDefinition("CMAKE_MAKEFILE_PRODUCTS"))
    {
    cmSystemTools::ExpandListArgument(productStr, products);
    }
  for(std::vector<std::string>::const_iterator pi = products.begin();
      pi != products.end(); ++pi)
    {
    if(!(cmSystemTools::FileExists(pi->c_str()) ||
         cmSystemTools::FileIsSymlink(*pi)))
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake, missing byproduct: " << *pi << "\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // Get the set of dependencies and outputs.
  std::vector<std::string> depends;
  std::vector<std::string> outputs;
  const char* dependsStr = mf->GetDefinition("CMAKE_MAKEFILE_DEPENDS");
  const char* outputsStr = mf->GetDefinition("CMAKE_MAKEFILE_OUTPUTS");
  if(dependsStr && outputsStr)
    {
    cmSystemTools::ExpandListArgument(dependsStr, depends);
    cmSystemTools::ExpandListArgument(outputsStr, outputs);
    }
  if(depends.empty() || outputs.empty())
    {
    // Not enough information was provided to do the test.  Just rerun.
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake no CMAKE_MAKEFILE_DEPENDS "
        "or CMAKE_MAKEFILE_OUTPUTS :\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }

  // Find the newest dependency.
  std::vector<std::string>::iterator dep = depends.begin();
  std::string dep_newest = *dep++;
  for(;dep != depends.end(); ++dep)
    {
    int result = 0;
    if(this->FileComparison->FileTimeCompare(dep_newest.c_str(),
                                             dep->c_str(), &result))
      {
      if(result < 0)
        {
        dep_newest = *dep;
        }
      }
    else
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake: build system dependency is missing\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // Find the oldest output.
  std::vector<std::string>::iterator out = outputs.begin();
  std::string out_oldest = *out++;
  for(;out != outputs.end(); ++out)
    {
    int result = 0;
    if(this->FileComparison->FileTimeCompare(out_oldest.c_str(),
                                             out->c_str(), &result))
      {
      if(result > 0)
        {
        out_oldest = *out;
        }
      }
    else
      {
      if(verbose)
        {
        std::ostringstream msg;
        msg << "Re-run cmake: build system output is missing\n";
        cmSystemTools::Stdout(msg.str().c_str());
        }
      return 1;
      }
    }

  // If any output is older than any dependency then rerun.
  {
  int result = 0;
  if(!this->FileComparison->FileTimeCompare(out_oldest.c_str(),
                                            dep_newest.c_str(),
                                            &result) ||
     result < 0)
    {
    if(verbose)
      {
      std::ostringstream msg;
      msg << "Re-run cmake file: " << out_oldest
          << " older than: " << dep_newest << "\n";
      cmSystemTools::Stdout(msg.str().c_str());
      }
    return 1;
    }
  }

  // No need to rerun.
  return 0;
}